

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeDumper.cpp
# Opt level: O2

void Js::AsmJsByteCodeDumper::Dump
               (FunctionBody *body,TypedRegisterAllocator *typedRegister,AsmJsFunc *asmFunc)

{
  ushort uVar1;
  code *pcVar2;
  byte *pbVar3;
  int iVar4;
  AsmJsVarType AVar5;
  Which WVar6;
  bool bVar7;
  byte bVar8;
  OpCodeAsmJs op;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  AsmJsFunctionInfo *this;
  undefined4 *puVar12;
  byte *pbVar13;
  ByteBlock *this_00;
  char16_t *pcVar14;
  ArgSlot i;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  ArgSlot i_1;
  undefined1 auStack_d8 [8];
  StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
  statementReader;
  undefined1 local_98 [8];
  ByteCodeReader reader;
  ulong local_78;
  ulong local_70;
  LayoutSize local_68;
  uint local_64;
  AsmJsVarType var;
  uint local_5c;
  uint local_58;
  ulong local_50;
  ulong local_38;
  
  ByteCodeReader::Create((ByteCodeReader *)local_98,body,0);
  auStack_d8 = (undefined1  [8])0x0;
  statementReader.m_startLocation = (byte *)0x0;
  statementReader.m_statementMap._0_4_ = 0xffffffff;
  statementReader._12_8_ = 0;
  statementReader.m_statementMapIter.accumulatedSourceBegin = 0;
  statementReader.m_statementMapIter.accumulatedBytecodeBegin = 0;
  statementReader.m_statementMapIter.indexOfActualOffset = 0;
  statementReader.m_fullstatementMap._0_4_ = 0;
  statementReader.m_fullstatementMap._4_4_ = 0;
  statementReader.m_nextStatementBoundary._0_4_ = 0;
  statementReader.m_nextStatementBoundary._4_1_ = 1;
  StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
  ::Create((StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
            *)auStack_d8,body,0);
  FunctionBody::DumpFullFunctionName(body);
  Output::Print(L" Asm.js (");
  this = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)2,Js::AsmJsFunctionInfo*>
                   ((FunctionProxy *)body);
  uVar1 = this->mArgCount;
  puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  for (uVar15 = 0; uVar1 != uVar15; uVar15 = uVar15 + 1) {
    AVar5 = AsmJsFunctionInfo::GetArgType(this,(ArgSlot)uVar15);
    local_68 = CONCAT31(local_68._1_3_,AVar5.which_);
    if (uVar15 != 0) {
      Output::Print(L", ");
      AVar5.which_ = (undefined1)local_68;
    }
    switch(AVar5.which_) {
    case Int:
      pcVar14 = L"In%hu|0";
      break;
    case Int64:
      pcVar14 = L"int64(In%hu)";
      break;
    case Double:
      pcVar14 = L"+In%hu";
      break;
    case Float:
      pcVar14 = L"flt(In%hu)";
      break;
    default:
      if ((byte)(AVar5.which_ - Int32x4) < 0xb) {
        WVar6 = AsmJsVarType::which((AsmJsVarType *)&local_68);
        switch(WVar6) {
        case Int32x4:
          pcVar14 = L"I4(In%hu)";
          break;
        default:
          goto switchD_0072d318_caseD_f;
        case Int8x16:
          pcVar14 = L"I16(In%hu)";
          break;
        case Float32x4:
          pcVar14 = L"F4(In%hu)";
          break;
        case Float64x2:
          pcVar14 = L"D2(In%hu)";
          break;
        case Int64x2:
          pcVar14 = L"I2(In%hu)";
        }
        break;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar12 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeDumper.cpp"
                                  ,0x47,"((0))","UNREACHED");
      if (bVar7) {
        *puVar12 = 0;
        goto switchD_0072d318_caseD_f;
      }
      goto LAB_0072d854;
    }
    Output::Print(pcVar14,(ulong)uVar15);
switchD_0072d318_caseD_f:
  }
  Output::Print(L") ");
  uVar9 = FunctionBody::GetByteCodeCount(body);
  uVar10 = FunctionBody::GetByteCodeWithoutLDACount(body);
  Output::Print(L"(size: %d [%d])\n",(ulong)uVar9,(ulong)uVar10);
  if (typedRegister == (TypedRegisterAllocator *)0x0 && asmFunc != (AsmJsFunc *)0x0) {
    typedRegister = &asmFunc->mTypedRegisterAllocator;
  }
  else if (typedRegister == (TypedRegisterAllocator *)0x0) {
    bVar7 = true;
    typedRegister = (TypedRegisterAllocator *)0x0;
    goto LAB_0072d41e;
  }
  WAsmJs::TypedRegisterAllocator::DumpLocalsInfo(typedRegister);
  bVar7 = false;
LAB_0072d41e:
  if (asmFunc != (AsmJsFunc *)0x0) {
    DumpConstants(asmFunc,body);
  }
  if (!bVar7) {
    Output::Print(L"    Implicit Arg Ins:\n    ======== =====\n    ");
    WAsmJs::TypedRegisterAllocator::GetArgumentStartIndex(typedRegister,&local_68);
    reader.m_endLocation = (byte *)(ulong)local_68;
    local_38 = (ulong)local_64;
    local_50 = (ulong)local_5c;
    local_78 = (ulong)_var;
    local_70 = (ulong)local_58;
    for (uVar15 = 0; uVar1 != uVar15; uVar15 = uVar15 + 1) {
      AVar5 = AsmJsFunctionInfo::GetArgType(this,(ArgSlot)uVar15);
      switch(AVar5.which_) {
      case Int:
        iVar16 = (int)reader.m_endLocation;
        Output::Print(L" I%d  In%d",reader.m_endLocation,(ulong)uVar15);
        reader.m_endLocation = (byte *)(ulong)(iVar16 + 1);
        break;
      case Int64:
        Output::Print(L" L%d  In%d",local_38,(ulong)uVar15);
        local_38 = (ulong)((int)local_38 + 1);
        break;
      case Double:
        Output::Print(L" D%d  In%d",local_50,(ulong)uVar15);
        local_50 = (ulong)((int)local_50 + 1);
        break;
      case Float:
        Output::Print(L" F%d  In%d",local_78,(ulong)uVar15);
        local_78 = (ulong)((int)local_78 + 1);
        break;
      default:
        if ((byte)(AVar5.which_ - Int32x4) < 0xb) {
          Output::Print(L" SIMD%d  In%d",local_70,(ulong)uVar15);
          local_70 = (ulong)((int)local_70 + 1);
        }
        else {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar12 = 1;
          bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeDumper.cpp"
                                      ,0x80,"((0))","UNREACHED");
          if (!bVar7) goto LAB_0072d854;
          *puVar12 = 0;
        }
      }
      Output::Print(L"\n    ");
    }
    Output::Print(L"\n");
  }
  uVar9 = 0;
  while( true ) {
    while (pbVar3 = (byte *)CONCAT44(statementReader.m_fullstatementMap._4_4_,
                                     statementReader.m_fullstatementMap._0_4_),
          pbVar13 = ByteCodeReader::GetIP((ByteCodeReader *)local_98), pbVar3 == pbVar13) {
      FunctionBody::PrintStatementSourceLine(body,uVar9);
      uVar9 = StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
              ::MoveNextStatementBoundary
                        ((StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
                          *)auStack_d8);
    }
    uVar10 = ByteCodeReader::GetCurrentOffset((ByteCodeReader *)local_98);
    op = ByteCodeReader::ReadAsmJsOp((ByteCodeReader *)local_98,&local_68);
    if (op == EndOfBlock) break;
    pcVar14 = L"";
    if (local_68 == MediumLayout) {
      pcVar14 = L"M-";
    }
    if (local_68 == LargeLayout) {
      pcVar14 = L"L-";
    }
    Output::Print(L"    %04x %2s",(ulong)uVar10,pcVar14);
    DumpOp(op,local_68,(ByteCodeReader *)local_98,body);
    if (DAT_0145948a == '\x01') {
      iVar16 = uVar10 + 2;
      uVar11 = ByteCodeReader::GetCurrentOffset((ByteCodeReader *)local_98);
      Output::SkipToColumn(0x46);
      if (local_68 == SmallLayout) {
LAB_0072d6fc:
        if (MaxByteSizedOpcodes < op) {
          uVar17 = 1;
          goto LAB_0072d70e;
        }
        Output::Print(L"   ");
        iVar16 = uVar10 + 1;
      }
      else {
        if (local_68 == MediumLayout) {
          iVar4 = 2;
        }
        else {
          if (local_68 != LargeLayout) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar12 = 1;
            bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeDumper.cpp"
                                        ,0xac,"(layoutSize == SmallLayout)",
                                        "layoutSize == SmallLayout");
            if (bVar7) {
              *puVar12 = 0;
              goto LAB_0072d6fc;
            }
            goto LAB_0072d854;
          }
          iVar4 = 4;
        }
        uVar17 = (ulong)((iVar4 + 1) - (uint)(op < InvalidOpCode));
LAB_0072d70e:
        Output::Print(L"%02X ",uVar17);
      }
      Output::Print(L"%02x",(ulong)(byte)op);
      for (; iVar16 < (int)uVar11; iVar16 = iVar16 + 1) {
        bVar8 = ByteCodeReader::GetRawByte((ByteCodeReader *)local_98,iVar16);
        Output::Print(L" %02x",(ulong)bVar8);
      }
    }
    Output::Print(L"\n");
  }
  uVar10 = ByteCodeReader::GetCurrentOffset((ByteCodeReader *)local_98);
  this_00 = FunctionBody::GetByteCode(body);
  uVar11 = ByteBlock::GetLength(this_00);
  if (uVar10 != uVar11) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar12 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeDumper.cpp"
                                ,0x94,
                                "(reader.GetCurrentOffset() == body->GetByteCode()->GetLength())",
                                "reader.GetCurrentOffset() == body->GetByteCode()->GetLength()");
    if (!bVar7) {
LAB_0072d854:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar12 = 0;
  }
  pbVar3 = (byte *)CONCAT44(statementReader.m_fullstatementMap._4_4_,
                            statementReader.m_fullstatementMap._0_4_);
  pbVar13 = ByteCodeReader::GetIP((ByteCodeReader *)local_98);
  if (pbVar3 == pbVar13) {
    FunctionBody::PrintStatementSourceLine(body,uVar9);
    StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
    ::MoveNextStatementBoundary
              ((StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
                *)auStack_d8);
  }
  Output::Print(L"\n");
  Output::Flush();
  return;
}

Assistant:

void AsmJsByteCodeDumper::Dump(FunctionBody* body, const WAsmJs::TypedRegisterAllocator* typedRegister, AsmJsFunc* asmFunc)
    {
        ByteCodeReader reader;
        reader.Create(body);
        StatementReader<FunctionBody::StatementMapList> statementReader;
        statementReader.Create(body);
        body->DumpFullFunctionName();
        Output::Print(_u(" Asm.js ("));
        AsmJsFunctionInfo* funcInfo = body->GetAsmJsFunctionInfo();
        const ArgSlot argCount = funcInfo->GetArgCount();
        for (ArgSlot i = 0; i < argCount; i++)
        {
            AsmJsVarType var = funcInfo->GetArgType(i);
            if (i > 0)
            {
                Output::Print(_u(", "));
            }
            if (var.isDouble())
            {
                Output::Print(_u("+In%hu"), i);
            }
            else if (var.isFloat())
            {
                Output::Print(_u("flt(In%hu)"), i);
            }
            else if (var.isInt())
            {
                Output::Print(_u("In%hu|0"), i);
            }
            else if (var.isInt64())
            {
                Output::Print(_u("int64(In%hu)"), i);
            }
            else if (var.isSIMD())
            {
                switch (var.which())
                {
                case AsmJsType::Int32x4:
                    Output::Print(_u("I4(In%hu)"), i);
                    break;
                case AsmJsType::Int8x16:
                    Output::Print(_u("I16(In%hu)"), i);
                    break;
                case AsmJsType::Float32x4:
                    Output::Print(_u("F4(In%hu)"), i);
                    break;
                case AsmJsType::Float64x2:
                    Output::Print(_u("D2(In%hu)"), i);
                    break;
                case AsmJsType::Int64x2:
                    Output::Print(_u("I2(In%hu)"), i);
                    break;
                }
            }
            else
            {
                Assert(UNREACHED);
            }
        }

        Output::Print(_u(") "));
        Output::Print(_u("(size: %d [%d])\n"), body->GetByteCodeCount(), body->GetByteCodeWithoutLDACount());

        if (!typedRegister && asmFunc)
        {
            typedRegister = &asmFunc->GetTypedRegisterAllocator();
        }

        if (typedRegister)
        {
            typedRegister->DumpLocalsInfo();
        }

        if (asmFunc)
        {
            DumpConstants(asmFunc, body);
        }

        if (typedRegister)
        {
            Output::Print(_u("    Implicit Arg Ins:\n    ======== =====\n    "));
            uint32 iArgs[WAsmJs::LIMIT];
            typedRegister->GetArgumentStartIndex(iArgs);
            uint32 iArg = iArgs[WAsmJs::INT32];
            uint32 lArg = iArgs[WAsmJs::INT64];
            uint32 dArg = iArgs[WAsmJs::FLOAT64];
            uint32 fArg = iArgs[WAsmJs::FLOAT32];
            uint32 simdArg = iArgs[WAsmJs::SIMD];
            for (ArgSlot i = 0; i < argCount; i++)
            {
                AsmJsVarType var = funcInfo->GetArgType(i);
                if (var.isDouble())
                {
                    Output::Print(_u(" D%d  In%d"), dArg++, i);
                }
                else if (var.isFloat())
                {
                    Output::Print(_u(" F%d  In%d"), fArg++, i);
                }
                else if (var.isInt())
                {
                    Output::Print(_u(" I%d  In%d"), iArg++, i);
                }
                else if (var.isInt64())
                {
                    Output::Print(_u(" L%d  In%d"), lArg++, i);
                }
                else if (var.isSIMD())
                {
                    Output::Print(_u(" SIMD%d  In%d"), simdArg++, i);
                }
                else
                {
                    Assert(UNREACHED);
                }
                Output::Print(_u("\n    "));
            }
            Output::Print(_u("\n"));
        }

        uint32 statementIndex = 0;
        while (true)
        {
            while (statementReader.AtStatementBoundary(&reader))
            {
                body->PrintStatementSourceLine(statementIndex);
                statementIndex = statementReader.MoveNextStatementBoundary();
            }
            int byteOffset = reader.GetCurrentOffset();
            LayoutSize layoutSize;
            OpCodeAsmJs op = reader.ReadAsmJsOp(layoutSize);
            if (op == OpCodeAsmJs::EndOfBlock)
            {
                Assert(reader.GetCurrentOffset() == body->GetByteCode()->GetLength());
                break;
            }
            Output::Print(_u("    %04x %2s"), byteOffset, layoutSize == LargeLayout ? _u("L-") : layoutSize == MediumLayout ? _u("M-") : _u(""));
            DumpOp(op, layoutSize, reader, body);
            if (Js::Configuration::Global.flags.Verbose)
            {
                int layoutStart = byteOffset + 2; // Account for the prefix op
                int endByteOffset = reader.GetCurrentOffset();
                Output::SkipToColumn(70);
                if (layoutSize == LargeLayout)
                {
                    Output::Print(_u("%02X "),
                        op > Js::OpCodeAsmJs::MaxByteSizedOpcodes ?
                        Js::OpCodeAsmJs::ExtendedLargeLayoutPrefix : Js::OpCodeAsmJs::LargeLayoutPrefix);
                }
                else if (layoutSize == MediumLayout)
                {
                    Output::Print(_u("%02X "),
                        op > Js::OpCodeAsmJs::MaxByteSizedOpcodes ?
                        Js::OpCodeAsmJs::ExtendedMediumLayoutPrefix : Js::OpCodeAsmJs::MediumLayoutPrefix);
                }
                else
                {
                    Assert(layoutSize == SmallLayout);
                    if (op > Js::OpCodeAsmJs::MaxByteSizedOpcodes)
                    {
                        Output::Print(_u("%02X "), Js::OpCodeAsmJs::ExtendedOpcodePrefix);
                    }
                    else
                    {
                        Output::Print(_u("   "));
                        layoutStart--; // don't have a prefix
                    }
                }

                Output::Print(_u("%02x"), (byte)op);
                for (int i = layoutStart; i < endByteOffset; i++)
                {
                    Output::Print(_u(" %02x"), reader.GetRawByte(i));
                }
            }
            Output::Print(_u("\n"));
        }
        if (statementReader.AtStatementBoundary(&reader))
        {
            body->PrintStatementSourceLine(statementIndex);
            statementIndex = statementReader.MoveNextStatementBoundary();
        }
        Output::Print(_u("\n"));
        Output::Flush();
    }